

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall
Tree::InsertPath(Tree *this,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *splitted,size_type start,string *fileName)

{
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  reference this_00;
  const_reference pvVar4;
  undefined1 local_d0 [8];
  Tree newFolder;
  Tree *folder;
  iterator __end1;
  iterator __begin1;
  vector<Tree,_std::allocator<Tree>_> *__range1;
  string *fileName_local;
  size_type start_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *splitted_local;
  Tree *this_local;
  
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(splitted);
  if (start == sVar3) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->files,fileName);
  }
  else {
    __end1 = std::vector<Tree,_std::allocator<Tree>_>::begin(&this->folders);
    folder = (Tree *)std::vector<Tree,_std::allocator<Tree>_>::end(&this->folders);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>
                                       *)&folder), bVar1) {
      this_00 = __gnu_cxx::__normal_iterator<Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>::
                operator*(&__end1);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](splitted,start);
      _Var2 = std::operator==(&this_00->path,pvVar4);
      if (_Var2) {
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(splitted);
        if (start + 1 < sVar3) {
          InsertPath(this_00,splitted,start + 1,fileName);
          return;
        }
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(&this_00->files,fileName);
        return;
      }
      __gnu_cxx::__normal_iterator<Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>::operator++
                (&__end1);
    }
    Tree((Tree *)local_d0);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](splitted,start);
    std::__cxx11::string::operator=((string *)local_d0,(string *)pvVar4);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(splitted);
    if (start + 1 < sVar3) {
      InsertPath((Tree *)local_d0,splitted,start + 1,fileName);
      std::vector<Tree,_std::allocator<Tree>_>::push_back(&this->folders,(value_type *)local_d0);
    }
    else {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&newFolder.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,fileName);
      std::vector<Tree,_std::allocator<Tree>_>::push_back(&this->folders,(value_type *)local_d0);
    }
    ~Tree((Tree *)local_d0);
  }
  return;
}

Assistant:

void Tree::InsertPath(const std::vector<std::string>& splitted,
                      std::vector<std::string>::size_type start,
                      const std::string& fileName)
{
  if (start == splitted.size()) {
    files.insert(fileName);
    return;
  }
  for (Tree& folder : folders) {
    if (folder.path == splitted[start]) {
      if (start + 1 < splitted.size()) {
        folder.InsertPath(splitted, start + 1, fileName);
        return;
      }
      // last part of splitted
      folder.files.insert(fileName);
      return;
    }
  }
  // Not found in folders, thus insert
  Tree newFolder;
  newFolder.path = splitted[start];
  if (start + 1 < splitted.size()) {
    newFolder.InsertPath(splitted, start + 1, fileName);
    folders.push_back(newFolder);
    return;
  }
  // last part of splitted
  newFolder.files.insert(fileName);
  folders.push_back(newFolder);
}